

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_softmax_impl(llama_token_data_array *cur_p)

{
  float fVar1;
  llama_token_data *plVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  llama_token_data *__i;
  llama_token_data *plVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  
  uVar4 = cur_p->size;
  if (uVar4 != 0) {
    if (cur_p->sorted == false) {
      plVar2 = cur_p->data;
      lVar5 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<llama_token_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                (plVar2,plVar2 + uVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)uVar4 < 0x11) {
        std::
        __insertion_sort<llama_token_data*,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                  (plVar2,plVar2 + uVar4);
      }
      else {
        plVar6 = plVar2 + 0x10;
        std::
        __insertion_sort<llama_token_data*,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                  (plVar2,plVar6);
        for (lVar5 = uVar4 * 0xc + -0xc0; lVar5 != 0; lVar5 = lVar5 + -0xc) {
          std::
          __unguarded_linear_insert<llama_token_data*,__gnu_cxx::__ops::_Val_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                    (plVar6);
          plVar6 = plVar6 + 1;
        }
      }
      cur_p->sorted = true;
      uVar4 = cur_p->size;
    }
    plVar2 = cur_p->data;
    fVar1 = plVar2->logit;
    pfVar3 = &plVar2->p;
    fVar10 = 0.0;
    uVar7 = uVar4;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      fVar9 = expf(pfVar3[-1] - fVar1);
      *pfVar3 = fVar9;
      fVar10 = fVar10 + fVar9;
      pfVar3 = pfVar3 + 3;
    }
    pfVar3 = &plVar2->p;
    while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
      *pfVar3 = *pfVar3 / fVar10;
      pfVar3 = pfVar3 + 3;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
             ,0xcc,"GGML_ASSERT(%s) failed","cur_p->size > 0");
}

Assistant:

static void llama_sampler_softmax_impl(llama_token_data_array * cur_p) {
    GGML_ASSERT(cur_p->size > 0);

    // Sort the logits in descending order
    if (!cur_p->sorted) {
        std::sort(cur_p->data, cur_p->data + cur_p->size, [](const llama_token_data & a, const llama_token_data & b) {
            return a.logit > b.logit;
        });
        cur_p->sorted = true;
    }

    float max_l = cur_p->data[0].logit;
    float cum_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        float p = expf(cur_p->data[i].logit - max_l);
        cur_p->data[i].p = p;
        cum_sum += p;
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= cum_sum;
    }
}